

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  MethodDescriptorProto *pMVar1;
  char *pcVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  Descriptor *pDVar5;
  string *psVar6;
  MethodOptions *pMVar7;
  MethodOptions *pMVar8;
  string_view sVar9;
  AlphaNum local_f0;
  string_view local_c0;
  AlphaNum local_b0;
  string_view local_80;
  MethodDescriptorProto *local_70;
  MethodDescriptorProto *proto_local;
  MethodDescriptor *this_local;
  char *local_58;
  string_view *local_50;
  MethodDescriptorProto *local_48;
  char *local_40;
  MethodDescriptorProto *local_38;
  char *local_30;
  MethodDescriptorProto *local_28;
  anon_union_48_1_493b367e_for_MethodDescriptorProto_3 *local_20;
  anon_union_48_1_493b367e_for_MethodDescriptorProto_3 *local_18;
  anon_union_48_1_493b367e_for_MethodDescriptorProto_3 *local_10;
  
  local_70 = proto;
  proto_local = (MethodDescriptorProto *)this;
  local_80 = name(this);
  local_50 = &local_80;
  local_10 = &proto->field_0;
  local_48 = proto;
  puVar3 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar3 = *puVar3 | 1;
  this_local = (MethodDescriptor *)local_50->_M_len;
  local_58 = local_50->_M_str;
  pAVar4 = MessageLite::GetArena((MessageLite *)proto);
  sVar9._M_str = local_58;
  sVar9._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,sVar9,pAVar4);
  pDVar5 = input_type(this);
  pMVar1 = local_70;
  if ((*(ushort *)&pDVar5->field_0x1 >> 1 & 1) == 0) {
    local_38 = local_70;
    local_40 = ".";
    local_18 = &local_70->field_0;
    puVar3 = internal::HasBits<1>::operator[](&(local_70->field_0)._impl_._has_bits_,0);
    pcVar2 = local_40;
    *puVar3 = *puVar3 | 2;
    pAVar4 = MessageLite::GetArena((MessageLite *)pMVar1);
    internal::ArenaStringPtr::Set(&(pMVar1->field_0)._impl_.input_type_,pcVar2,pAVar4);
  }
  psVar6 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(local_70);
  pDVar5 = input_type(this);
  local_c0 = Descriptor::full_name(pDVar5);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,local_c0);
  absl::lts_20250127::StrAppend(psVar6,&local_b0);
  pDVar5 = output_type(this);
  pMVar1 = local_70;
  if ((*(ushort *)&pDVar5->field_0x1 >> 1 & 1) == 0) {
    local_28 = local_70;
    local_30 = ".";
    local_20 = &local_70->field_0;
    puVar3 = internal::HasBits<1>::operator[](&(local_70->field_0)._impl_._has_bits_,0);
    pcVar2 = local_30;
    *puVar3 = *puVar3 | 4;
    pAVar4 = MessageLite::GetArena((MessageLite *)pMVar1);
    internal::ArenaStringPtr::Set(&(pMVar1->field_0)._impl_.output_type_,pcVar2,pAVar4);
  }
  psVar6 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(local_70);
  pDVar5 = output_type(this);
  sVar9 = Descriptor::full_name(pDVar5);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,sVar9);
  absl::lts_20250127::StrAppend(psVar6,&local_f0);
  pMVar7 = options(this);
  pMVar8 = MethodOptions::default_instance();
  if (pMVar7 != pMVar8) {
    pMVar7 = options(this);
    pMVar8 = MethodDescriptorProto::mutable_options(local_70);
    MethodOptions::operator=(pMVar8,pMVar7);
  }
  if ((this->client_streaming_ & 1U) != 0) {
    MethodDescriptorProto::set_client_streaming(local_70,true);
  }
  if ((this->server_streaming_ & 1U) != 0) {
    MethodDescriptorProto::set_server_streaming(local_70,true);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::MethodDescriptorProto>
            (this->proto_features_,local_70);
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  absl::StrAppend(proto->mutable_input_type(), input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  absl::StrAppend(proto->mutable_output_type(), output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    *proto->mutable_options() = options();
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}